

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Script::~Script(Script *this)

{
  pointer pVVar1;
  RuntimeID *pRVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pVVar4;
  RuntimeID *pRVar5;
  _Rb_tree_node_base *p_Var6;
  CollectionPtr c;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pVVar1 = (this->m_stack).
           super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar4 = (this->m_stack).
                super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
    if (pVVar4->m_type == Collection) {
      Variant::GetCollection((Variant *)&local_40);
      p_Var6 = (_Rb_tree_node_base *)(local_40 + 8);
      for (p_Var3 = *(_Rb_tree_node_base **)(local_40 + 0x18); p_Var3 != p_Var6;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        Variant::SetNull((Variant *)&p_Var3[2]._M_parent);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    }
  }
  pRVar2 = (this->m_localFunctions).
           super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar5 = (this->m_localFunctions).
                super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1) {
    Runtime::UnregisterFunction
              ((this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,*pRVar5);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&this->m_name);
  std::any::reset(&this->m_userContext);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>::
  ~_Vector_base(&(this->m_localFunctions).
                 super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
               );
  std::
  _Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
  ::~_Vector_base(&(this->m_idIndexData).
                   super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
                 );
  std::_Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>::
  ~_Vector_base(&(this->m_scopeStack).
                 super__Vector_base<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>
               );
  std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::~vector
            (&this->m_stack);
  std::
  vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
  ::~vector(&this->m_execution);
  (this->m_staticArena).m_ptr = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Jinx::Impl::Script>)._M_weak_this.
              super___weak_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

inline_t Script::~Script()
	{
		// Clear potential circular references by explicitly destroying collection values
		for (auto & s : m_stack)
		{
			if (s.IsCollection())
			{
				auto c = s.GetCollection();
				for (auto & e : *c)
				{
					e.second.SetNull();
				}
			}
		}

		// Unregister local functions
		for (auto id : m_localFunctions)
			m_runtime->UnregisterFunction(id);
	}